

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O3

bool divsufsortxx::helper::
     partition<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
               (iterator Td,iterator first1,iterator first2,iterator last,iterator *mfirst,
               iterator *mlast,value_type *v)

{
  BitmapArray<long> *pBVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  long lVar4;
  pos_type pVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  pos_type pVar10;
  BitmapArray<long> *pBVar11;
  ulong uVar12;
  long lVar13;
  pos_type pVar14;
  iterator first1_00;
  iterator first1_01;
  iterator last1;
  iterator last1_00;
  iterator first2_00;
  ulong local_70;
  ulong local_58;
  
  pVar14 = last.pos_;
  uVar6 = first2.pos_;
  first2_00.array_ = first2.array_;
  pVar5 = first1.pos_;
  pVar10 = Td.pos_;
  pBVar11 = Td.array_;
  if (uVar6 < last.pos_) {
    do {
      iVar2 = (*((first2_00.array_)->super_Bitmap)._vptr_Bitmap[5])(first2_00.array_,uVar6);
      iVar2 = (*(pBVar11->super_Bitmap)._vptr_Bitmap[5])
                        (pBVar11,CONCAT44(extraout_var,iVar2) + pVar10);
      lVar9 = CONCAT44(extraout_var_00,iVar2);
      lVar4 = *v;
      if (lVar9 != lVar4) break;
      uVar6 = uVar6 + 1;
    } while (uVar6 < pVar14);
  }
  else {
    lVar4 = *v;
    lVar9 = 0;
  }
  uVar12 = pVar14;
  pBVar1 = last.array_;
  local_58 = uVar6;
  if ((uVar6 < pVar14) && (lVar9 < lVar4)) {
    while (uVar6 = uVar6 + 1, pBVar1 = last.array_, uVar6 < pVar14) {
      iVar2 = (*((first2_00.array_)->super_Bitmap)._vptr_Bitmap[5])(first2_00.array_,uVar6);
      iVar2 = (*(pBVar11->super_Bitmap)._vptr_Bitmap[5])
                        (pBVar11,CONCAT44(extraout_var_01,iVar2) + pVar10);
      pBVar1 = last.array_;
      if (*v < CONCAT44(extraout_var_02,iVar2)) break;
      if (CONCAT44(extraout_var_02,iVar2) == *v) {
        iVar2 = (*((first2_00.array_)->super_Bitmap)._vptr_Bitmap[5])(first2_00.array_,uVar6);
        iVar3 = (*((first2_00.array_)->super_Bitmap)._vptr_Bitmap[5])(first2_00.array_,local_58);
        (*((first2_00.array_)->super_Bitmap)._vptr_Bitmap[4])
                  (first2_00.array_,uVar6,CONCAT44(extraout_var_04,iVar3));
        (*((first2_00.array_)->super_Bitmap)._vptr_Bitmap[4])
                  (first2_00.array_,local_58,CONCAT44(extraout_var_03,iVar2));
        local_58 = local_58 + 1;
      }
    }
  }
  do {
    uVar7 = uVar12;
    uVar12 = uVar7 - 1;
    if (uVar12 <= uVar6) {
      local_70 = uVar7 - 1;
      uVar8 = local_70;
      goto LAB_0010d873;
    }
    iVar2 = (*(pBVar1->super_Bitmap)._vptr_Bitmap[5])(pBVar1,uVar12);
    iVar2 = (*(pBVar11->super_Bitmap)._vptr_Bitmap[5])
                      (pBVar11,CONCAT44(extraout_var_05,iVar2) + pVar10);
  } while (CONCAT44(extraout_var_06,iVar2) == *v);
  local_70 = uVar7 - 1;
  uVar8 = local_70;
  if (*v < CONCAT44(extraout_var_06,iVar2)) {
    uVar7 = uVar7 - 2;
    local_70 = uVar12;
    uVar8 = uVar7;
    for (; uVar6 < uVar7; uVar7 = uVar7 - 1) {
      iVar2 = (*(pBVar1->super_Bitmap)._vptr_Bitmap[5])(pBVar1,uVar7);
      iVar2 = (*(pBVar11->super_Bitmap)._vptr_Bitmap[5])
                        (pBVar11,CONCAT44(extraout_var_07,iVar2) + pVar10);
      uVar8 = uVar7;
      if (CONCAT44(extraout_var_08,iVar2) < *v) break;
      uVar12 = local_70;
      if (CONCAT44(extraout_var_08,iVar2) == *v) {
        uVar12 = local_70 - 1;
        iVar2 = (*(pBVar1->super_Bitmap)._vptr_Bitmap[5])(pBVar1,uVar7);
        iVar3 = (*(pBVar1->super_Bitmap)._vptr_Bitmap[5])(pBVar1,local_70);
        (*(pBVar1->super_Bitmap)._vptr_Bitmap[4])(pBVar1,uVar7,CONCAT44(extraout_var_10,iVar3));
        (*(pBVar1->super_Bitmap)._vptr_Bitmap[4])(pBVar1,local_70,CONCAT44(extraout_var_09,iVar2));
      }
      local_70 = uVar12;
      uVar8 = uVar6;
    }
  }
LAB_0010d873:
  if (uVar6 < uVar8) {
    iVar2 = (*((first2_00.array_)->super_Bitmap)._vptr_Bitmap[5])(first2_00.array_,uVar6);
    iVar3 = (*(pBVar1->super_Bitmap)._vptr_Bitmap[5])(pBVar1,uVar8);
    (*((first2_00.array_)->super_Bitmap)._vptr_Bitmap[4])
              (first2_00.array_,uVar6,CONCAT44(extraout_var_12,iVar3));
    (*(pBVar1->super_Bitmap)._vptr_Bitmap[4])(pBVar1,uVar8,CONCAT44(extraout_var_11,iVar2));
    uVar12 = uVar6 + 1;
    uVar6 = uVar12;
    if (uVar12 < uVar8) {
      do {
        iVar2 = (*((first2_00.array_)->super_Bitmap)._vptr_Bitmap[5])(first2_00.array_,uVar12);
        iVar2 = (*(pBVar11->super_Bitmap)._vptr_Bitmap[5])
                          (pBVar11,CONCAT44(extraout_var_13,iVar2) + pVar10);
        uVar6 = uVar12;
        if (*v < CONCAT44(extraout_var_14,iVar2)) break;
        if (CONCAT44(extraout_var_14,iVar2) == *v) {
          iVar2 = (*((first2_00.array_)->super_Bitmap)._vptr_Bitmap[5])(first2_00.array_,uVar12);
          iVar3 = (*((first2_00.array_)->super_Bitmap)._vptr_Bitmap[5])(first2_00.array_,local_58);
          (*((first2_00.array_)->super_Bitmap)._vptr_Bitmap[4])
                    (first2_00.array_,uVar12,CONCAT44(extraout_var_16,iVar3));
          (*((first2_00.array_)->super_Bitmap)._vptr_Bitmap[4])
                    (first2_00.array_,local_58,CONCAT44(extraout_var_15,iVar2));
          local_58 = local_58 + 1;
        }
        uVar12 = uVar12 + 1;
        uVar6 = uVar8;
      } while (uVar8 != uVar12);
    }
    uVar12 = uVar8 - 1;
    uVar8 = uVar12;
    uVar7 = local_70;
    for (; local_70 = uVar7, uVar6 < uVar12; uVar12 = uVar12 - 1) {
      iVar2 = (*(pBVar1->super_Bitmap)._vptr_Bitmap[5])(pBVar1,uVar12);
      iVar2 = (*(pBVar11->super_Bitmap)._vptr_Bitmap[5])
                        (pBVar11,CONCAT44(extraout_var_17,iVar2) + pVar10);
      uVar8 = uVar12;
      if (CONCAT44(extraout_var_18,iVar2) < *v) break;
      if (CONCAT44(extraout_var_18,iVar2) == *v) {
        local_70 = uVar7 - 1;
        iVar2 = (*(pBVar1->super_Bitmap)._vptr_Bitmap[5])(pBVar1,uVar12);
        iVar3 = (*(pBVar1->super_Bitmap)._vptr_Bitmap[5])(pBVar1,uVar7);
        (*(pBVar1->super_Bitmap)._vptr_Bitmap[4])(pBVar1,uVar12,CONCAT44(extraout_var_20,iVar3));
        (*(pBVar1->super_Bitmap)._vptr_Bitmap[4])(pBVar1,uVar7,CONCAT44(extraout_var_19,iVar2));
      }
      uVar8 = uVar6;
      uVar7 = local_70;
    }
    goto LAB_0010d873;
  }
  if (local_70 < local_58) {
    mfirst->array_ = first1.array_;
    mfirst->pos_ = pVar5;
    if (mlast == &last) goto LAB_0010db14;
  }
  else {
    lVar9 = uVar6 - local_58;
    lVar4 = local_58 - pVar5;
    if (lVar9 < (long)(local_58 - pVar5)) {
      lVar4 = lVar9;
    }
    first1_00.pos_ = uVar6 - lVar4;
    first1_00.array_ = first2_00.array_;
    last1.pos_ = uVar6;
    last1.array_ = first2_00.array_;
    vecswap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
              (first1_00,last1,first1);
    lVar13 = (local_70 - uVar6) + 1;
    lVar4 = ~local_70 + pVar14;
    if (lVar13 <= (long)(~local_70 + pVar14)) {
      lVar4 = lVar13;
    }
    first1_01.pos_ = pVar14 - lVar4;
    first1_01.array_ = pBVar1;
    last1_00.pos_ = pVar14;
    last1_00.array_ = pBVar1;
    first2_00.pos_ = uVar6;
    vecswap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
              (first1_01,last1_00,first2_00);
    mfirst->array_ = first1.array_;
    mfirst->pos_ = lVar9 + pVar5;
    pVar14 = pVar14 - lVar13;
  }
  mlast->array_ = pBVar1;
  mlast->pos_ = pVar14;
LAB_0010db14:
  return local_58 <= local_70;
}

Assistant:

bool partition(
    const StringIterator_type Td, SAIterator_type first1,
    SAIterator_type first2, SAIterator_type last, SAIterator_type &mfirst,
    SAIterator_type &mlast,
    const typename std::iterator_traits<StringIterator_type>::value_type &v) {
  SAIterator_type a, b, c, d;
  typename std::iterator_traits<StringIterator_type>::value_type x = 0;

  for (b = first2; (b < last) && ((x = Td[*b]) == v); ++b) {
  }
  if (((a = b) < last) && (x < v)) {
    for (; (++b < last) && ((x = Td[*b]) <= v);) {
      if (x == v) {
        std::iter_swap(b, a++);
      }
    }
  }
  for (c = last; (b < --c) && ((x = Td[*c]) == v);) {
  }
  if ((b < (d = c)) && (x > v)) {
    for (; (b < --c) && ((x = Td[*c]) >= v);) {
      if (x == v) {
        std::iter_swap(c, d--);
      }
    }
  }
  for (; b < c;) {
    std::iter_swap(b, c);
    for (; (++b < c) && ((x = Td[*b]) <= v);) {
      if (x == v) {
        std::iter_swap(b, a++);
      }
    }
    for (; (b < --c) && ((x = Td[*c]) >= v);) {
      if (x == v) {
        std::iter_swap(c, d--);
      }
    }
  }

  if (a <= d) {
    vecswap(b - std::min(a - first1, b - a), b, first1);
    vecswap(last - std::min(d + 1 - b, last - d - 1), last, b);
    mfirst = first1 + (b - a), mlast = last - (d + 1 - b);
    return true;
  }
  mfirst = first1, mlast = last;
  return false;
}